

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O2

int xOctaveInit(OctaveNoise *noise,Xoroshiro *xr,PerlinNoise *octaves,double *amplitudes,int omin,
               int len,int nmax)

{
  uint64_t uVar1;
  uint64_t uVar2;
  long lVar3;
  uint64_t *puVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  Xoroshiro pxr;
  Xoroshiro local_40;
  
  dVar6 = xOctaveInit::lacuna_ini[-omin];
  dVar7 = xOctaveInit::persist_ini[len];
  uVar1 = xNextLong(xr);
  uVar2 = xNextLong(xr);
  puVar4 = xOctaveInit::md5_octave_n[omin + 0xc] + 1;
  lVar3 = 0;
  iVar5 = 0;
  while ((lVar3 < len && (iVar5 != nmax))) {
    if ((amplitudes[lVar3] != 0.0) || (NAN(amplitudes[lVar3]))) {
      local_40.lo = (*(uint64_t (*) [2])(puVar4 + -1))[0] ^ uVar1;
      local_40.hi = *puVar4 ^ uVar2;
      xPerlinInit(octaves + iVar5,&local_40);
      octaves[iVar5].amplitude = amplitudes[lVar3] * dVar7;
      octaves[iVar5].lacunarity = dVar6;
      iVar5 = iVar5 + 1;
    }
    lVar3 = lVar3 + 1;
    dVar6 = dVar6 + dVar6;
    dVar7 = dVar7 * 0.5;
    puVar4 = puVar4 + 2;
  }
  noise->octaves = octaves;
  noise->octcnt = iVar5;
  return iVar5;
}

Assistant:

int xOctaveInit(OctaveNoise *noise, Xoroshiro *xr, PerlinNoise *octaves,
        const double *amplitudes, int omin, int len, int nmax)
{
    static const uint64_t md5_octave_n[][2] = {
        {0xb198de63a8012672, 0x7b84cad43ef7b5a8}, // md5 "octave_-12"
        {0x0fd787bfbc403ec3, 0x74a4a31ca21b48b8}, // md5 "octave_-11"
        {0x36d326eed40efeb2, 0x5be9ce18223c636a}, // md5 "octave_-10"
        {0x082fe255f8be6631, 0x4e96119e22dedc81}, // md5 "octave_-9"
        {0x0ef68ec68504005e, 0x48b6bf93a2789640}, // md5 "octave_-8"
        {0xf11268128982754f, 0x257a1d670430b0aa}, // md5 "octave_-7"
        {0xe51c98ce7d1de664, 0x5f9478a733040c45}, // md5 "octave_-6"
        {0x6d7b49e7e429850a, 0x2e3063c622a24777}, // md5 "octave_-5"
        {0xbd90d5377ba1b762, 0xc07317d419a7548d}, // md5 "octave_-4"
        {0x53d39c6752dac858, 0xbcd1c5a80ab65b3e}, // md5 "octave_-3"
        {0xb4a24d7a84e7677b, 0x023ff9668e89b5c4}, // md5 "octave_-2"
        {0xdffa22b534c5f608, 0xb9b67517d3665ca9}, // md5 "octave_-1"
        {0xd50708086cef4d7c, 0x6e1651ecc7f43309}, // md5 "octave_0"
    };
    static const double lacuna_ini[] = { // -omin = 3..12
        1, .5, .25, 1./8, 1./16, 1./32, 1./64, 1./128, 1./256, 1./512, 1./1024,
        1./2048, 1./4096,
    };
    static const double persist_ini[] = { // len = 4..9
        0, 1, 2./3, 4./7, 8./15, 16./31, 32./63, 64./127, 128./255, 256./511,
    };
#if DEBUG
    if (-omin < 0 || -omin >= (int) (sizeof(lacuna_ini)/sizeof(double)) ||
        len < 0 || len >= (int) (sizeof(persist_ini)/sizeof(double)))
    {
        printf("Fatal: octave initialization out of range\n");
        exit(1);
    }
#endif
    double lacuna = lacuna_ini[-omin];
    double persist = persist_ini[len];
    uint64_t xlo = xNextLong(xr);
    uint64_t xhi = xNextLong(xr);
    int i = 0, n = 0;

    for (; i < len && n != nmax; i++, lacuna *= 2.0, persist *= 0.5)
    {
        if (amplitudes[i] == 0)
            continue;
        Xoroshiro pxr;
        pxr.lo = xlo ^ md5_octave_n[12 + omin + i][0];
        pxr.hi = xhi ^ md5_octave_n[12 + omin + i][1];
        xPerlinInit(&octaves[n], &pxr);
        octaves[n].amplitude = amplitudes[i] * persist;
        octaves[n].lacunarity = lacuna;
        n++;
    }

    noise->octaves = octaves;
    noise->octcnt = n;
    return n;
}